

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLog>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  int iVar8;
  GetterXsYs<unsigned_int> *pGVar9;
  TransformerLinLog *pTVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  double dVar14;
  ImVec2 IVar15;
  ushort uVar16;
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  bool bVar19;
  long lVar20;
  ImDrawIdx IVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  ImVec2 IVar25;
  float fVar26;
  ImVec2 IVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  pIVar17 = GImPlot;
  pGVar9 = this->Getter1;
  pTVar10 = this->Transformer;
  iVar8 = pGVar9->Count;
  lVar20 = (long)(((pGVar9->Offset + prim + 1) % iVar8 + iVar8) % iVar8) * (long)pGVar9->Stride;
  uVar22 = *(uint *)((long)pGVar9->Xs + lVar20);
  dVar14 = log10((double)*(uint *)((long)pGVar9->Ys + lVar20) /
                 GImPlot->CurrentPlot->YAxis[pTVar10->YAxis].Range.Min);
  pIVar18 = GImPlot;
  iVar8 = pTVar10->YAxis;
  pIVar11 = pIVar17->CurrentPlot;
  dVar7 = pIVar11->YAxis[iVar8].Range.Min;
  fVar24 = (float)(((double)uVar22 - (pIVar11->XAxis).Range.Min) * pIVar17->Mx +
                  (double)pIVar17->PixelRange[iVar8].Min.x);
  fVar23 = (float)((((double)(float)(dVar14 / pIVar17->LogDenY[iVar8]) *
                     (pIVar11->YAxis[iVar8].Range.Max - dVar7) + dVar7) - dVar7) *
                   pIVar17->My[iVar8] + (double)pIVar17->PixelRange[iVar8].Min.y);
  pGVar9 = this->Getter2;
  pTVar10 = this->Transformer;
  iVar8 = pGVar9->Count;
  lVar20 = (long)(((prim + 1 + pGVar9->Offset) % iVar8 + iVar8) % iVar8) * (long)pGVar9->Stride;
  uVar22 = *(uint *)((long)pGVar9->Xs + lVar20);
  dVar14 = log10((double)*(uint *)((long)pGVar9->Ys + lVar20) /
                 GImPlot->CurrentPlot->YAxis[pTVar10->YAxis].Range.Min);
  iVar8 = pTVar10->YAxis;
  pIVar11 = pIVar18->CurrentPlot;
  dVar7 = pIVar11->YAxis[iVar8].Range.Min;
  fVar28 = (float)(((double)uVar22 - (pIVar11->XAxis).Range.Min) * pIVar18->Mx +
                  (double)pIVar18->PixelRange[iVar8].Min.x);
  fVar30 = (float)((((double)(float)(dVar14 / pIVar18->LogDenY[iVar8]) *
                     (pIVar11->YAxis[iVar8].Range.Max - dVar7) + dVar7) - dVar7) *
                   pIVar18->My[iVar8] + (double)pIVar18->PixelRange[iVar8].Min.y);
  fVar2 = (this->P11).x;
  fVar3 = (this->P11).y;
  fVar4 = (this->P12).x;
  fVar5 = (this->P12).y;
  fVar26 = fVar3;
  if (fVar5 <= fVar3) {
    fVar26 = fVar5;
  }
  if (fVar23 <= fVar26) {
    fVar26 = fVar23;
  }
  if (fVar30 <= fVar26) {
    fVar26 = fVar30;
  }
  bVar19 = false;
  if ((fVar26 < (cull_rect->Max).y) &&
     (fVar26 = (float)(~-(uint)(fVar5 <= fVar3) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar3) & (uint)fVar3), uVar22 = -(uint)(fVar23 <= fVar26),
     fVar26 = (float)(~uVar22 & (uint)fVar23 | uVar22 & (uint)fVar26),
     uVar22 = -(uint)(fVar30 <= fVar26),
     fVar26 = (float)(~uVar22 & (uint)fVar30 | uVar22 & (uint)fVar26), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar26 && fVar26 != *pfVar1)) {
    fVar26 = fVar2;
    if (fVar4 <= fVar2) {
      fVar26 = fVar4;
    }
    if (fVar24 <= fVar26) {
      fVar26 = fVar24;
    }
    if (fVar28 <= fVar26) {
      fVar26 = fVar28;
    }
    bVar19 = false;
    if (fVar26 < (cull_rect->Max).x) {
      fVar26 = (float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 |
                      -(uint)(fVar4 <= fVar2) & (uint)fVar2);
      uVar22 = -(uint)(fVar24 <= fVar26);
      fVar26 = (float)(~uVar22 & (uint)fVar24 | uVar22 & (uint)fVar26);
      uVar22 = -(uint)(fVar28 <= fVar26);
      fVar26 = (float)(~uVar22 & (uint)fVar28 | uVar22 & (uint)fVar26);
      bVar19 = (cull_rect->Min).x <= fVar26 && fVar26 != (cull_rect->Min).x;
    }
  }
  IVar25.y = fVar23;
  IVar25.x = fVar24;
  IVar27.y = fVar30;
  IVar27.x = fVar28;
  if (bVar19 != false) {
    fVar26 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar32 = fVar2 * fVar23 - fVar24 * fVar3;
    fVar31 = fVar4 * fVar30 - fVar28 * fVar5;
    fVar29 = (fVar2 - fVar24) * (fVar5 - fVar30) - (fVar4 - fVar28) * (fVar3 - fVar23);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = this->Col;
    pIVar12[1].pos = IVar25;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = this->Col;
    IVar15.y = ((fVar5 - fVar30) * fVar32 - (fVar3 - fVar23) * fVar31) / fVar29;
    IVar15.x = (fVar32 * (fVar4 - fVar28) - (fVar2 - fVar24) * fVar31) / fVar29;
    pIVar12[2].pos = IVar15;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = this->Col;
    pIVar12[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = this->Col;
    pIVar12[4].pos = IVar27;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar12 + 5;
    uVar22 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar21 = (ImDrawIdx)uVar22;
    *pIVar13 = IVar21;
    uVar16 = -(ushort)(fVar6 < fVar26 && fVar23 < fVar30 || fVar26 < fVar6 && fVar30 < fVar23) & 1;
    pIVar13[1] = IVar21 + uVar16 + 1;
    pIVar13[2] = IVar21 + 3;
    pIVar13[3] = IVar21 + 1;
    pIVar13[4] = (uVar16 ^ 3) + IVar21;
    pIVar13[5] = IVar21 + 4;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar22 + 5;
  }
  this->P11 = IVar25;
  this->P12 = IVar27;
  return bVar19;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }